

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  int *piVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  float *pfVar4;
  undefined1 auVar5 [16];
  int iVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  float *pfVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  undefined1 auVar13 [16];
  ImGuiContext *ctx;
  
  pIVar7 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  fVar2 = (GImGui->Style).ItemInnerSpacing.x;
  auVar5 = vcvtdq2ps_avx(ZEXT416((uint)(int)((w_full - fVar2 * (float)(components + -1)) /
                                            (float)components)));
  auVar13 = SUB6416(ZEXT464(0x3f800000),0);
  auVar5 = vmaxss_avx(auVar13,auVar5);
  fVar12 = auVar5._0_4_;
  auVar5 = vcvtdq2ps_avx(ZEXT416((uint)(int)(w_full - (fVar2 + fVar12) * (float)(components + -1))))
  ;
  iVar11 = (pIVar3->DC).ItemWidthStack.Size;
  if (iVar11 == (pIVar3->DC).ItemWidthStack.Capacity) {
    if (iVar11 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar11 / 2 + iVar11;
    }
    iVar8 = iVar11 + 1;
    if (iVar11 + 1 < iVar10) {
      iVar8 = iVar10;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    pfVar9 = (float *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
    pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
    if (pfVar4 != (float *)0x0) {
      memcpy(pfVar9,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
      pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
      if ((pfVar4 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pfVar4,GImAllocatorUserData);
    }
    (pIVar3->DC).ItemWidthStack.Data = pfVar9;
    (pIVar3->DC).ItemWidthStack.Capacity = iVar8;
    iVar11 = (pIVar3->DC).ItemWidthStack.Size;
    auVar13 = SUB6416(ZEXT464(0x3f800000),0);
  }
  else {
    pfVar9 = (pIVar3->DC).ItemWidthStack.Data;
  }
  auVar5 = vmaxss_avx(auVar13,auVar5);
  pfVar9[iVar11] = (pIVar3->DC).ItemWidth;
  iVar10 = (pIVar3->DC).ItemWidthStack.Size;
  iVar11 = iVar10 + 1;
  (pIVar3->DC).ItemWidthStack.Size = iVar11;
  if (iVar11 == (pIVar3->DC).ItemWidthStack.Capacity) {
    iVar10 = iVar10 + 2;
    if (iVar11 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar11 / 2 + iVar11;
    }
    if (iVar10 < iVar11) {
      iVar10 = iVar11;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pfVar9 = (float *)(*GImAllocatorAllocFunc)((long)iVar10 << 2,GImAllocatorUserData);
    pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
    if (pfVar4 != (float *)0x0) {
      memcpy(pfVar9,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
      pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
      if ((pfVar4 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pfVar4,GImAllocatorUserData);
    }
    (pIVar3->DC).ItemWidthStack.Data = pfVar9;
    (pIVar3->DC).ItemWidthStack.Capacity = iVar10;
    iVar11 = (pIVar3->DC).ItemWidthStack.Size;
  }
  else {
    pfVar9 = (pIVar3->DC).ItemWidthStack.Data;
  }
  pfVar9[iVar11] = auVar5._0_4_;
  iVar11 = (pIVar3->DC).ItemWidthStack.Size + 1;
  (pIVar3->DC).ItemWidthStack.Size = iVar11;
  if (2 < components) {
    iVar10 = components + -2;
    do {
      if (iVar11 == (pIVar3->DC).ItemWidthStack.Capacity) {
        if (iVar11 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar11 / 2 + iVar11;
        }
        iVar6 = iVar11 + 1;
        if (iVar11 + 1 < iVar8) {
          iVar6 = iVar8;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pfVar9 = (float *)(*GImAllocatorAllocFunc)((long)iVar6 << 2,GImAllocatorUserData);
        pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
        if (pfVar4 != (float *)0x0) {
          memcpy(pfVar9,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
          pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
          if ((pfVar4 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pfVar4,GImAllocatorUserData);
        }
        (pIVar3->DC).ItemWidthStack.Data = pfVar9;
        (pIVar3->DC).ItemWidthStack.Capacity = iVar6;
        iVar11 = (pIVar3->DC).ItemWidthStack.Size;
      }
      else {
        pfVar9 = (pIVar3->DC).ItemWidthStack.Data;
      }
      pfVar9[iVar11] = fVar12;
      iVar11 = (pIVar3->DC).ItemWidthStack.Size + 1;
      (pIVar3->DC).ItemWidthStack.Size = iVar11;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  fVar2 = auVar5._0_4_;
  if (components != 1) {
    fVar2 = fVar12;
  }
  (pIVar3->DC).ItemWidth = fVar2;
  *(byte *)&(pIVar7->NextItemData).Flags = (byte)(pIVar7->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = g.Style;
    const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_full - (style.ItemInnerSpacing.x) * (components - 1)) / (float)components));
    const float w_item_last = ImMax(1.0f, IM_FLOOR(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components - 1)));
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components - 2; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = (components == 1) ? w_item_last : w_item_one;
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}